

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O2

interval_t duckdb::ToQuartersOperator::Operation<int,duckdb::interval_t>(int input)

{
  bool bVar1;
  int left;
  OutOfRangeException *this;
  allocator local_51;
  uint local_50 [4];
  string local_40;
  
  left = Cast::Operation<int,int>(input);
  bVar1 = TryMultiplyOperator::Operation<int,int,int>(left,3,(int32_t *)local_50);
  if (bVar1) {
    return (interval_t)ZEXT416(local_50[0]);
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Interval value %d quarters out of range",&local_51);
  OutOfRangeException::OutOfRangeException<int>(this,&local_40,input);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_QUARTER,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %d quarters out of range", input);
		}
		result.days = 0;
		result.micros = 0;
		return result;
	}